

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readTokenSkippingComments(OurReader *this,Token *token)

{
  bool bVar1;
  bool local_19;
  bool success;
  Token *token_local;
  OurReader *this_local;
  
  local_19 = readToken(this,token);
  if (((this->features_).allowComments_ & 1U) != 0) {
    while( true ) {
      bVar1 = false;
      if (local_19 != false) {
        bVar1 = token->type_ == tokenComment;
      }
      if (!bVar1) break;
      local_19 = readToken(this,token);
    }
  }
  return local_19;
}

Assistant:

bool OurReader::readTokenSkippingComments(Token& token) {
  bool success = readToken(token);
  if (features_.allowComments_) {
    while (success && token.type_ == tokenComment) {
      success = readToken(token);
    }
  }
  return success;
}